

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

void __thiscall
Internal_FontDelta::Internal_FontDelta
          (Internal_FontDelta *this,ON_Font *target_font,ON_wString *target_clean_logfont_name,
          ON_wString *target_clean_family_name,ON_Font *candidate_font)

{
  ON_Font *pOVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  int iVar9;
  wchar_t *pwVar10;
  wchar_t *pwVar11;
  ON_SHA1_Hash *a;
  ON_SHA1_Hash *b;
  byte bVar12;
  byte bVar13;
  ON_wString *pOVar14;
  ON_wString *src;
  ON_wString installed_font_logfont_name;
  ON_wString candidate_clean_family_name;
  ON_wString target_postscript_name;
  ON_wString local_70;
  ON_wString local_68;
  ON_wString local_60;
  ON_wString *local_58;
  ON_wString local_50;
  ON_wString local_48;
  ON_wString *local_40;
  int *local_38;
  
  this->m_candidate_font = candidate_font;
  local_38 = &this->m_hash_delta;
  this->m_hash_delta = 0;
  this->m_family_name_delta = 0;
  this->m_logfont_name_delta = 0;
  this->m_weight_delta = 0;
  this->m_weight_delta = 0;
  this->m_stretch_delta = 0;
  this->m_style_delta = 0;
  this->m_underline_and_strikethrough_delta = 0;
  if (candidate_font == (ON_Font *)0x0) {
    *local_38 = 6;
  }
  else {
    local_58 = target_clean_family_name;
    bVar2 = ON_wString::IsNotEmpty(&target_font->m_loc_postscript_name);
    pOVar14 = &target_font->m_en_postscript_name;
    if (bVar2) {
      pOVar14 = &target_font->m_loc_postscript_name;
    }
    ON_wString::ON_wString(&local_48,pOVar14);
    bVar2 = ON_wString::IsNotEmpty(&local_48);
    if (bVar2) {
      pwVar10 = ON_wString::operator_cast_to_wchar_t_(&local_48);
      pOVar1 = this->m_candidate_font;
      pOVar14 = &pOVar1->m_loc_postscript_name;
      local_40 = target_clean_logfont_name;
      bVar3 = ON_wString::IsNotEmpty(pOVar14);
      src = &pOVar1->m_en_postscript_name;
      if (bVar3) {
        src = pOVar14;
      }
      ON_wString::ON_wString(&local_50,src);
      pwVar11 = ON_wString::operator_cast_to_wchar_t_(&local_50);
      bVar3 = ON_wString::EqualOrdinal(pwVar10,pwVar11,true);
      target_clean_logfont_name = local_40;
    }
    else {
      bVar3 = false;
    }
    if (bVar2) {
      ON_wString::~ON_wString(&local_50);
    }
    bVar2 = true;
    if (bVar3 == false) {
      if (((target_font->m_font_origin == WindowsFont) &&
          (candidate_font->m_font_origin == WindowsFont)) &&
         (bVar2 = ON_wString::IsNotEmpty(target_clean_logfont_name), bVar2)) {
        bVar2 = ON_wString::IsEmpty(target_clean_logfont_name);
        if (bVar2) {
          bVar2 = false;
        }
        else {
          bVar2 = ON_wString::IsNotEmpty(&candidate_font->m_loc_windows_logfont_name);
          pOVar14 = &candidate_font->m_en_windows_logfont_name;
          if (bVar2) {
            pOVar14 = &candidate_font->m_loc_windows_logfont_name;
          }
          ON_wString::ON_wString(&local_70,pOVar14);
          pwVar10 = ON_wString::operator_cast_to_wchar_t_(&local_70);
          Internal_NameOverlapCleanName((wchar_t *)&local_68,SUB81(pwVar10,0));
          ON_wString::~ON_wString(&local_70);
          pwVar10 = ON_wString::operator_cast_to_wchar_t_(target_clean_logfont_name);
          pwVar11 = ON_wString::operator_cast_to_wchar_t_(&local_68);
          bVar2 = ON_wString::EqualOrdinal(pwVar10,pwVar11,true);
          ON_wString::~ON_wString(&local_68);
        }
      }
      else {
        bVar2 = false;
      }
    }
    if (bVar3 == false) {
      uVar4 = (uint)target_font->m_font_weight - (uint)candidate_font->m_font_weight;
      uVar5 = -uVar4;
      if (0 < (int)uVar4) {
        uVar5 = uVar4;
      }
      this->m_weight_delta = uVar5 & 0xff;
      uVar4 = (uint)target_font->m_font_stretch - (uint)candidate_font->m_font_stretch;
      uVar5 = -uVar4;
      if (0 < (int)uVar4) {
        uVar5 = uVar4;
      }
      uVar5 = uVar5 & 0xff;
    }
    else {
      this->m_weight_delta = 0;
      uVar5 = 0;
    }
    this->m_stretch_delta = uVar5;
    uVar5 = 0;
    if (bVar3 == false) {
      iVar6 = (uint)target_font->m_font_style - (uint)candidate_font->m_font_style;
      bVar13 = (byte)iVar6;
      bVar12 = -bVar13;
      if (0 < iVar6) {
        bVar12 = bVar13;
      }
      uVar5 = (uint)bVar12;
    }
    this->m_style_delta = uVar5;
    ON_wString::ON_wString(&local_60);
    bVar3 = true;
    if (bVar2 == false) {
      bVar3 = ON_wString::IsNotEmpty(&candidate_font->m_loc_family_name);
      pOVar14 = &candidate_font->m_en_family_name;
      if (bVar3) {
        pOVar14 = &candidate_font->m_loc_family_name;
      }
      ON_wString::ON_wString(&local_70,pOVar14);
      pwVar10 = ON_wString::operator_cast_to_wchar_t_(&local_70);
      Internal_NameOverlapCleanName((wchar_t *)&local_68,SUB81(pwVar10,0));
      ON_wString::operator=(&local_60,&local_68);
      ON_wString::~ON_wString(&local_68);
      ON_wString::~ON_wString(&local_70);
      pwVar10 = ON_wString::operator_cast_to_wchar_t_(local_58);
      pwVar11 = ON_wString::operator_cast_to_wchar_t_(&local_60);
      bVar3 = ON_wString::EqualOrdinal(pwVar10,pwVar11,true);
    }
    if (target_font->m_font_bUnderlined != candidate_font->m_font_bUnderlined) {
      this->m_underline_and_strikethrough_delta = this->m_underline_and_strikethrough_delta + 1;
    }
    if (target_font->m_font_bStrikethrough != candidate_font->m_font_bStrikethrough) {
      this->m_underline_and_strikethrough_delta = this->m_underline_and_strikethrough_delta + 1;
    }
    this->m_family_name_delta = 0;
    if (((this->m_style_delta == 0 && this->m_stretch_delta == 0) &
        this->m_weight_delta == 0 & bVar3) == 1) {
      if (this->m_underline_and_strikethrough_delta == 0) {
        a = ON_Font::FontCharacteristicsHash(target_font);
        b = ON_Font::FontCharacteristicsHash(candidate_font);
        bVar2 = ::operator==(a,b);
      }
      else {
        bVar2 = false;
      }
      uVar5 = (uint)(bVar2 ^ 1);
    }
    else {
      bVar13 = this->m_style_delta < 2 & bVar2 & this->m_stretch_delta == 0;
      if (bVar3 == false && bVar13 == 0) {
        pwVar10 = ON_wString::operator_cast_to_wchar_t_(&local_60);
        iVar6 = 0;
        if (pwVar10 != (wchar_t *)0x0) {
          pwVar11 = ON_wString::operator_cast_to_wchar_t_(local_58);
          wVar8 = *pwVar10;
          if (0x19 < (uint)(wVar8 + L'\xffffffbf') && wVar8 != L'\0') {
            while ((wVar8 < L'\x80' && (0x19 < (uint)(wVar8 + L'\xffffff9f')))) {
              wVar8 = pwVar10[1];
              pwVar10 = pwVar10 + 1;
              if ((wVar8 == L'\0') || ((uint)(wVar8 + L'\xffffffbf') < 0x1a)) break;
            }
          }
          wVar8 = *pwVar11;
          iVar6 = 0;
          if (wVar8 != L'\0') {
            iVar6 = 0;
            do {
              wVar7 = ON_wString::MapCharacterOrdinal(LowerOrdinal,*pwVar10);
              if (wVar8 != wVar7) break;
              wVar8 = pwVar10[1];
              pwVar10 = pwVar10 + 1;
              if (0x19 < (uint)(wVar8 + L'\xffffffbf') && wVar8 != L'\0') {
                while ((wVar8 < L'\x80' && (0x19 < (uint)(wVar8 + L'\xffffff9f')))) {
                  wVar8 = pwVar10[1];
                  pwVar10 = pwVar10 + 1;
                  if ((wVar8 == L'\0') || ((uint)(wVar8 + L'\xffffffbf') < 0x1a)) break;
                }
              }
              iVar6 = iVar6 + 1;
              pwVar11 = pwVar11 + 1;
              wVar8 = *pwVar11;
            } while (wVar8 != L'\0');
          }
        }
        iVar9 = ON_wString::Length(local_58);
        this->m_family_name_delta = iVar9 - iVar6;
        if (iVar9 - iVar6 == 0) {
          iVar6 = ON_wString::Length(local_58);
          iVar9 = ON_wString::Length(&local_60);
          this->m_family_name_delta = iVar6 - iVar9;
        }
        uVar5 = 4;
        if (this->m_style_delta != 0) {
          uVar5 = target_font->m_font_style == Upright | 4;
        }
      }
      else {
        uVar5 = bVar13 ^ 3;
      }
    }
    *local_38 = uVar5;
    ON_wString::~ON_wString(&local_60);
    ON_wString::~ON_wString(&local_48);
  }
  return;
}

Assistant:

Internal_FontDelta(
    const ON_Font& target_font,
    const ON_wString& target_clean_logfont_name,
    const ON_wString& target_clean_family_name,
    const ON_Font* candidate_font
  )
    : m_candidate_font(candidate_font)
  {
    if (nullptr == m_candidate_font)
    {
      m_hash_delta = 6;
      return;
    }

    // When we have identical PostScript names, we assume they
    // are correct and assume font family, weight, stretch, and style 
    // are exact matches.
    const ON_wString target_postscript_name = target_font.PostScriptName();
    const bool bEqualPostScriptName
      = target_postscript_name.IsNotEmpty()
      && ON_wString::EqualOrdinal(target_postscript_name, m_candidate_font->PostScriptName(), true);

    const bool bEqualLogfontName
      = bEqualPostScriptName
      || (
         ON_Font::Origin::WindowsFont == target_font.FontOrigin()
         && ON_Font::Origin::WindowsFont == candidate_font->FontOrigin()
         && target_clean_logfont_name.IsNotEmpty()
         && Internal_EqualLogfontName(target_clean_logfont_name, candidate_font)
         );

    m_weight_delta 
      = bEqualPostScriptName
      ? 0
      : abs(((int)static_cast<unsigned int>(target_font.FontWeight())) - ((int)static_cast<unsigned int>(candidate_font->FontWeight())));
    m_stretch_delta 
      = bEqualPostScriptName
      ? 0
      : abs(((int)static_cast<unsigned int>(target_font.FontStretch())) - ((int)static_cast<unsigned int>(candidate_font->FontStretch())));
    m_style_delta 
      = bEqualPostScriptName
      ? 0
      : abs(((int)static_cast<unsigned int>(target_font.FontStyle())) - ((int)static_cast<unsigned int>(candidate_font->FontStyle())));

    ON_wString candidate_clean_family_name;
    const bool bEqualFamilyName 
      = bEqualLogfontName 
      || Internal_EqualFamilyName(target_clean_family_name, candidate_font, candidate_clean_family_name);      

    if (target_font.IsUnderlined() != candidate_font->IsUnderlined())
      m_underline_and_strikethrough_delta++;
    if (target_font.IsStrikethrough() != candidate_font->IsStrikethrough())
      m_underline_and_strikethrough_delta++;

    m_family_name_delta = 0;


    if (
      bEqualFamilyName
      && 0 == m_weight_delta
      && 0 == m_stretch_delta
      && 0 == m_style_delta
      )
    {
      // This is either an exact match (m_hash_delta = 0) or a very close match (m_hash_delta = 1).
      m_hash_delta 
        = (0 == m_underline_and_strikethrough_delta && target_font.FontCharacteristicsHash() == candidate_font->FontCharacteristicsHash()) 
        ? 0
        : 1;
      return;
    }

    // If PANOSE information were available for target_font and candidate_font, it would be useful here.

    if (
      bEqualLogfontName 
      && 0 == m_stretch_delta 
      && m_style_delta <= 1
      )
    {
      // There are at most 4 "faces" with the same WINDOWS LOGFONT.lfFaceName and the differences
      // among the four "faces" are almost always in weight (normal or bold) or style (upright or italic). 
      // Fonts with larger differences in weight or style or any significant difference in stretch 
      // typically have different values of LOGFONT.lfFaceName.
      // (Underlined and Strikethrough are not "faces").
      m_hash_delta = 2;
      return;
    }

    if (bEqualFamilyName)
    {
      // A family, like "Arial", can have manu faces with a wide variety of weights, stretches, and styles.
      // The LOGFONTs with lfFaceName = "Arial", "Arial Narrow", "Arial Black", ... are all in the "Arial" family.
      m_hash_delta = 3;
      return;
    }

    // Differences below here (m_hash_delta >= 4) are generally visually significant.
    // Calculate font family name overlap
    int name_overlap = Internal_NameOverLap(target_clean_family_name, candidate_clean_family_name, true);
    m_family_name_delta = target_clean_family_name.Length() - name_overlap;
    if (0 == m_family_name_delta)
    {
      // clean_font_family_name.Length() = name_overlap means that
      // clean_font_family_name.Length() <= installed_font_family_name.Length()
      // and installed_font_family_name begins with clean_font_family_name.
      // If installed_font_family_name.Length() > clean_font_family_name.Length(),
      // m_name_delta < 0 and it measures how much tail was not matched
      m_family_name_delta = target_clean_family_name.Length() - candidate_clean_family_name.Length();
    }

    m_hash_delta 
      = (0 == m_style_delta || ON_Font::Style::Upright != target_font.FontStyle())
      ? 4
      : 5;
  }